

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

PropertyString * __thiscall
Js::ScriptContext::CreateAndCacheSymbolOrPropertyString<Js::PropertyString>
          (ScriptContext *this,PropertyRecord *propertyRecord)

{
  PropertyString *this_00;
  JavascriptLibrary *pJVar1;
  PropertyId local_2c;
  PropertyString *local_28;
  PropertyString *prop;
  PropertyStringCacheMap *propertyMap;
  PropertyRecord *propertyRecord_local;
  ScriptContext *this_local;
  
  propertyMap = (PropertyStringCacheMap *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  pJVar1 = GetLibrary(this);
  prop = (PropertyString *)JavascriptLibrary::EnsurePropertyStringMap(pJVar1);
  pJVar1 = GetLibrary(this);
  local_28 = JavascriptLibrary::CreatePropertyString(pJVar1,(PropertyRecord *)propertyMap);
  this_00 = prop;
  local_2c = PropertyRecord::GetPropertyId((PropertyRecord *)propertyMap);
  JsUtil::
  SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  ::Item((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          *)this_00,&local_2c,&local_28);
  return local_28;
}

Assistant:

PropertyString* ScriptContext::CreateAndCacheSymbolOrPropertyString<PropertyString>(const PropertyRecord* propertyRecord)
    {
        // Library doesn't cache PropertyString instances because we might hold them in the 2-letter cache instead.
        PropertyStringCacheMap* propertyMap = this->GetLibrary()->EnsurePropertyStringMap();
        PropertyString* prop = this->GetLibrary()->CreatePropertyString(propertyRecord);
#if ENABLE_WEAK_REFERENCE_REGIONS
        propertyMap->Item(propertyRecord->GetPropertyId(), prop);
#else
        propertyMap->Item(propertyRecord->GetPropertyId(), recycler->CreateWeakReferenceHandle(prop));
#endif
        return prop;
    }